

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle_p.h
# Opt level: O1

void __thiscall QCommonStylePrivate::~QCommonStylePrivate(QCommonStylePrivate *this)

{
  QStyleOptionViewItem *this_00;
  Data *pDVar1;
  ulong uVar2;
  ulong uVar3;
  Data *pDVar4;
  const_iterator begin;
  
  *(undefined ***)&this->super_QStylePrivate = &PTR__QCommonStylePrivate_007f7340;
  pDVar4 = (this->animations).d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else if (pDVar4->spans->offsets[0] == 0xff) {
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (pDVar4->numBuckets == uVar3) {
        pDVar4 = (Data *)0x0;
        uVar3 = 0;
        break;
      }
      uVar2 = uVar3 + 1;
    } while (pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    goto LAB_0033d790;
  }
  uVar3 = 0;
LAB_0033d790:
  begin.i.bucket = uVar3;
  begin.i.d = pDVar4;
  qDeleteAll<QHash<QObject_const*,QStyleAnimation*>::const_iterator>
            (begin,(const_iterator)ZEXT816(0));
  this_00 = this->cachedOption;
  if (this_00 != (QStyleOptionViewItem *)0x0) {
    QBrush::~QBrush(&this_00->backgroundBrush);
    pDVar1 = (this_00->text).d.d;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((this_00->text).d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&this_00->icon);
    QLocale::~QLocale(&this_00->locale);
    QFont::~QFont(&this_00->font);
    QStyleOption::~QStyleOption(&this_00->super_QStyleOption);
    operator_delete(this_00,0xd0);
  }
  QHash<const_QObject_*,_QStyleAnimation_*>::~QHash(&this->animations);
  QIcon::~QIcon(&this->tabBarcloseButtonIcon);
  *(undefined ***)&this->super_QStylePrivate = &PTR__QStylePrivate_007f7690;
  pDVar1 = (this->super_QStylePrivate).name.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->super_QStylePrivate).name.d.d)->super_QArrayData,2,0x10);
    }
  }
  QObjectPrivate::~QObjectPrivate((QObjectPrivate *)this);
  return;
}

Assistant:

~QCommonStylePrivate()
    {
#if QT_CONFIG(animation)
        qDeleteAll(animations);
#endif
#if QT_CONFIG(itemviews)
        delete cachedOption;
#endif
    }